

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O1

bool __thiscall
absl::lts_20240722::log_internal::EncodeBytesTruncate
          (log_internal *this,uint64_t tag,Span<const_char> value,Span<char> *buf)

{
  anon_unknown_1 *paVar1;
  anon_unknown_1 *paVar2;
  anon_unknown_1 *paVar3;
  size_t sVar4;
  size_t sVar5;
  anon_unknown_1 *paVar6;
  Span<char> *size;
  Span<char> *buf_00;
  undefined8 *size_00;
  uint64_t value_00;
  anon_unknown_1 *__dest;
  undefined1 uVar7;
  anon_unknown_1 *this_00;
  bool bVar8;
  
  size = (Span<char> *)value.len_;
  this_00 = (anon_unknown_1 *)value.ptr_;
  paVar2 = (anon_unknown_1 *)((long)this * 8 + 2);
  buf_00 = size;
  value_00 = tag;
  sVar4 = VarintSize((uint64_t)paVar2);
  __dest = (anon_unknown_1 *)size->len_;
  if (this_00 <= (anon_unknown_1 *)size->len_) {
    __dest = this_00;
  }
  sVar5 = VarintSize((uint64_t)__dest);
  paVar1 = (anon_unknown_1 *)(sVar5 + sVar4);
  paVar3 = (anon_unknown_1 *)size->len_;
  if (((paVar1 <= paVar3) &&
      (paVar6 = paVar1 + (long)this_00 + -(long)paVar3,
      paVar3 <= paVar1 + (long)this_00 && paVar6 != (anon_unknown_1 *)0x0)) &&
     (bVar8 = this_00 < paVar6, this_00 = this_00 + -(long)paVar6, bVar8)) {
LAB_0010161f:
    EncodeBytesTruncate();
    paVar2 = (anon_unknown_1 *)((long)__dest * 8 + 2);
    sVar4 = VarintSize((uint64_t)paVar2);
    if ((ulong)size_00[1] < value_00) {
      value_00 = size_00[1];
    }
    sVar5 = VarintSize(value_00);
    if ((ulong)size_00[1] < sVar5 + sVar4) {
      size_00[1] = 0;
      uVar7 = 0;
    }
    else {
      anon_unknown_1::EncodeRawVarint(paVar2,sVar4,(size_t)size_00,buf_00);
      uVar7 = (undefined1)*size_00;
      anon_unknown_1::EncodeRawVarint((anon_unknown_1 *)0x0,sVar5,(size_t)size_00,buf_00);
    }
    return (bool)uVar7;
  }
  if (paVar3 < paVar1 + (long)this_00) {
    buf_00 = (Span<char> *)0x0;
  }
  else {
    anon_unknown_1::EncodeRawVarint(paVar2,sVar4,(size_t)size,buf_00);
    anon_unknown_1::EncodeRawVarint(this_00,sVar5,(size_t)size,buf_00);
    __dest = (anon_unknown_1 *)size->ptr_;
    memcpy(__dest,(void *)tag,(size_t)this_00);
    buf_00 = (Span<char> *)((anon_unknown_1 *)size->len_ + -(long)this_00);
    if ((anon_unknown_1 *)size->len_ < this_00) {
      EncodeBytesTruncate();
      value_00 = tag;
      goto LAB_0010161f;
    }
    size->ptr_ = (pointer)(this_00 + (long)size->ptr_);
  }
  size->len_ = (size_type)buf_00;
  return paVar1 + (long)this_00 <= paVar3;
}

Assistant:

bool EncodeBytesTruncate(uint64_t tag, absl::Span<const char> value,
                         absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::kLengthDelimited);
  const size_t tag_type_size = VarintSize(tag_type);
  uint64_t length = value.size();
  const size_t length_size =
      VarintSize(std::min<uint64_t>(length, buf->size()));
  if (tag_type_size + length_size <= buf->size() &&
      tag_type_size + length_size + value.size() > buf->size()) {
    value.remove_suffix(tag_type_size + length_size + value.size() -
                        buf->size());
    length = value.size();
  }
  if (tag_type_size + length_size + value.size() > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  EncodeRawVarint(length, length_size, buf);
  memcpy(buf->data(), value.data(), value.size());
  buf->remove_prefix(value.size());
  return true;
}